

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tcg_exec_init_arm(uc_struct_conflict1 *uc,uint32_t tb_size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  TCGContext_conflict *pTVar4;
  void *addr;
  void **ppvVar5;
  int iVar6;
  uint uVar7;
  TCGContext_conflict *tcg_ctx;
  void *pvVar8;
  size_t size;
  size_t __len;
  
  pTVar4 = (TCGContext_conflict *)g_malloc(0x9f50);
  uc->tcg_ctx = pTVar4;
  tcg_context_init_arm(pTVar4);
  uc->tcg_ctx->uc = uc;
  page_size_init_arm(uc);
  iVar1 = uc->init_target_page->bits;
  if (iVar1 == 0) {
    __assert_fail("TARGET_PAGE_BITS",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                  ,0xab,"void page_table_config_init(struct uc_struct *)");
  }
  iVar6 = -iVar1 + 0x28;
  uVar7 = iVar6 % 10;
  uVar3 = -iVar1 + 0x32 + (iVar6 / 10) * -10;
  if (3 < uVar7) {
    uVar3 = uVar7;
  }
  uc->v_l1_size = 1 << ((byte)uVar3 & 0x1f);
  iVar2 = 0x28 - (iVar1 + uVar3);
  uc->v_l1_shift = iVar2;
  iVar6 = iVar2 >> 0x1f;
  iVar1 = iVar2 / 10 + iVar6;
  uc->v_l2_levels = (iVar1 - iVar6) + -1;
  if (0xd < uVar3) {
    __assert_fail("v_l1_bits <= V_L1_MAX_BITS",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                  ,0xb6,"void page_table_config_init(struct uc_struct *)");
  }
  if (iVar2 + (iVar1 - iVar6) * -10 != 0) {
    __assert_fail("uc->v_l1_shift % V_L2_BITS == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                  ,0xb7,"void page_table_config_init(struct uc_struct *)");
  }
  if (9 < iVar2) {
    qht_init(&(uc->tcg_ctx->tb_ctx).htable,tb_cmp,0x8000,1);
    pTVar4 = uc->tcg_ctx;
    uVar3 = 0x100000;
    if (0x100000 < tb_size) {
      uVar3 = tb_size;
    }
    if (0x7fffffff < uVar3) {
      uVar3 = 0x80000000;
    }
    __len = 0x40000000;
    if (tb_size != 0) {
      __len = (size_t)uVar3;
    }
    pTVar4->code_gen_buffer_size = __len;
    addr = mmap64((void *)0x0,__len,7,0x22,-1,0);
    pvVar8 = (void *)0x0;
    if (addr != (void *)0xffffffffffffffff) {
      qemu_madvise(addr,__len,0xe);
      pvVar8 = addr;
    }
    pTVar4->code_gen_buffer = pvVar8;
    pTVar4->initial_buffer = pvVar8;
    pTVar4->initial_buffer_size = pTVar4->code_gen_buffer_size;
    uc->tcg_buffer_size = (uint32_t)pTVar4->code_gen_buffer_size;
    if (pvVar8 != (void *)0x0) {
      tcg_prologue_init_arm(uc->tcg_ctx);
      ppvVar5 = (void **)g_malloc0(0x10000);
      uc->l1_map = ppvVar5;
      uc->uc_invalidate_tb = uc_invalidate_tb;
      uc->uc_gen_tb = uc_gen_tb;
      uc->tb_flush_arm = uc_tb_flush;
      uc->add_inline_hook = uc_add_inline_hook_arm;
      uc->del_inline_hook = uc_del_inline_hook_arm;
      return;
    }
    tcg_exec_init_arm_cold_1();
    return;
  }
  __assert_fail("uc->v_l2_levels >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                ,0xb8,"void page_table_config_init(struct uc_struct *)");
}

Assistant:

void tcg_exec_init(struct uc_struct *uc, uint32_t tb_size)
{
    /* remove tcg object. init here. */
    /* tcg class init: tcg-all.c:tcg_accel_class_init(), skip all. */
    /* tcg object init: tcg-all.c:tcg_accel_instance_init(), skip all. */
    /* tcg init: tcg-all.c: tcg_init(), skip all. */
    /* run tcg_exec_init() here. */
    uc->tcg_ctx = g_malloc(sizeof(TCGContext));
    tcg_context_init(uc->tcg_ctx);
    uc->tcg_ctx->uc = uc;
    page_init(uc);
    tb_htable_init(uc);
    code_gen_alloc(uc, tb_size);
    tb_exec_unlock(uc->tcg_ctx);
    tcg_prologue_init(uc->tcg_ctx);
    /* cpu_interrupt_handler is not used in uc1 */
    uc->l1_map = g_malloc0(sizeof(void *) * V_L1_MAX_SIZE);
    /* Invalidate / Cache TBs */
    uc->uc_invalidate_tb = uc_invalidate_tb;
    uc->uc_gen_tb = uc_gen_tb;
    uc->tb_flush = uc_tb_flush;

    /* Inline hooks optimization */
    uc->add_inline_hook = uc_add_inline_hook;
    uc->del_inline_hook = uc_del_inline_hook;
}